

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O3

UBool __thiscall icu_63::BMPSet::contains(BMPSet *this,UChar32 c)

{
  uint uVar1;
  uint uVar2;
  int32_t iVar3;
  int32_t hi;
  
  if ((uint)c < 0x100) {
    uVar2 = (uint)(byte)this->latin1Contains[(uint)c];
  }
  else if ((uint)c < 0x800) {
    uVar2 = (uint)((this->table7FF[c & 0x3f] >> ((uint)c >> 6 & 0x1f) & 1) != 0);
  }
  else {
    if ((uint)c < 0xd800 || (c & 0xffffe000U) == 0xe000) {
      uVar1 = (uint)c >> 0xc;
      uVar2 = *(uint *)((long)this->bmpBlockBits + (ulong)((uint)c >> 4 & 0xfc)) >>
              ((byte)uVar1 & 0x1f) & 0x10001;
      if (uVar2 < 2) goto LAB_002fbc30;
      iVar3 = this->list4kStarts[uVar1];
      hi = this->list4kStarts[(ulong)uVar1 + 1];
    }
    else {
      if (0x10ffff < (uint)c) {
        uVar2 = 0;
        goto LAB_002fbc30;
      }
      iVar3 = this->list4kStarts[0xd];
      hi = this->list4kStarts[0x11];
    }
    iVar3 = findCodePoint(this,c,iVar3,hi);
    uVar2 = (uint)((byte)iVar3 & 1);
  }
LAB_002fbc30:
  return (UBool)uVar2;
}

Assistant:

UBool
BMPSet::contains(UChar32 c) const {
    if((uint32_t)c<=0xff) {
        return (UBool)latin1Contains[c];
    } else if((uint32_t)c<=0x7ff) {
        return (UBool)((table7FF[c&0x3f]&((uint32_t)1<<(c>>6)))!=0);
    } else if((uint32_t)c<0xd800 || (c>=0xe000 && c<=0xffff)) {
        int lead=c>>12;
        uint32_t twoBits=(bmpBlockBits[(c>>6)&0x3f]>>lead)&0x10001;
        if(twoBits<=1) {
            // All 64 code points with the same bits 15..6
            // are either in the set or not.
            return (UBool)twoBits;
        } else {
            // Look up the code point in its 4k block of code points.
            return containsSlow(c, list4kStarts[lead], list4kStarts[lead+1]);
        }
    } else if((uint32_t)c<=0x10ffff) {
        // surrogate or supplementary code point
        return containsSlow(c, list4kStarts[0xd], list4kStarts[0x11]);
    } else {
        // Out-of-range code points get FALSE, consistent with long-standing
        // behavior of UnicodeSet::contains(c).
        return FALSE;
    }
}